

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O2

nifti_image * nifti_make_new_nim(int *dims,int datatype,int data_fill)

{
  int iVar1;
  size_t __nmemb;
  nifti_1_header *__src;
  nifti_image *nim;
  void *pvVar2;
  long lVar3;
  undefined1 *puVar4;
  undefined1 *puVar5;
  byte bVar6;
  nifti_1_header in_stack_fffffffffffffd28;
  undefined1 local_178 [352];
  
  bVar6 = 0;
  __src = nifti_make_new_header(dims,datatype);
  if (__src != (nifti_1_header *)0x0) {
    memcpy(local_178,__src,0x15c);
    puVar4 = local_178;
    puVar5 = &stack0xfffffffffffffd28;
    for (lVar3 = 0x15c; lVar3 != 0; lVar3 = lVar3 + -1) {
      *puVar5 = *puVar4;
      puVar4 = puVar4 + (ulong)bVar6 * -2 + 1;
      puVar5 = puVar5 + (ulong)bVar6 * -2 + 1;
    }
    nim = nifti_convert_nhdr2nim(in_stack_fffffffffffffd28,(char *)0x0);
    free(__src);
    if (nim == (nifti_image *)0x0) {
      fwrite("** NMNN: nifti_convert_nhdr2nim failure\n",0x28,1,_stderr);
    }
    else {
      if (1 < g_opts_0) {
        fprintf(_stderr,"+d nifti_make_new_nim, data_fill = %d\n",(ulong)(uint)data_fill);
      }
      if (data_fill == 0) {
        return nim;
      }
      __nmemb = nim->nvox;
      iVar1 = nim->nbyper;
      pvVar2 = calloc(__nmemb,(long)iVar1);
      nim->data = pvVar2;
      if (pvVar2 != (void *)0x0) {
        return nim;
      }
      fprintf(_stderr,"** NMNN: failed to alloc %u bytes for data\n",
              (ulong)(uint)(iVar1 * (int)__nmemb));
      nifti_image_free(nim);
    }
  }
  return (nifti_image *)0x0;
}

Assistant:

nifti_image * nifti_make_new_nim(const int dims[], int datatype, int data_fill)
{
   nifti_image    * nim;
   nifti_1_header * nhdr;

   nhdr = nifti_make_new_header(dims, datatype);
   if( !nhdr ) return NULL;  /* error already printed */

   nim = nifti_convert_nhdr2nim(*nhdr,NULL);
   free(nhdr);               /* in any case, we are done with this */
   if( !nim ){
      fprintf(stderr,"** NMNN: nifti_convert_nhdr2nim failure\n");
      return NULL;
   }

   if( g_opts.debug > 1 )
      fprintf(stderr,"+d nifti_make_new_nim, data_fill = %d\n",data_fill);

   if( data_fill ) {
      nim->data = calloc(nim->nvox, nim->nbyper);

      /* if we cannot allocate data, take ball and go home */
      if( !nim->data ) {
         fprintf(stderr,"** NMNN: failed to alloc %u bytes for data\n",
                 (unsigned)(nim->nvox*nim->nbyper));
         nifti_image_free(nim);
         nim = NULL;
      }
   }

   return nim;
}